

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifstreambuf.cpp
# Opt level: O2

int __thiscall sai::ifstreambuf::open(ifstreambuf *this,char *__file,int __oflag,...)

{
  char cVar1;
  ulong uVar2;
  int __fd;
  
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
              (&this->FileIn,(path *)__file,_S_bin|_S_ate);
    __fd = (int)__file;
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 != '\0') {
      uVar2 = std::istream::tellg();
      if ((uVar2 & 0xfff) == 0) {
        this->PageCount = (uint)(uVar2 >> 0xc) & 0xfffff;
        (**(code **)(*(long *)this + 0x28))(this,0,0,8);
        goto LAB_00108889;
      }
    }
    close(this,__fd);
  }
  this = (ifstreambuf *)0x0;
LAB_00108889:
  return (int)this;
}

Assistant:

ifstreambuf* ifstreambuf::open(const std::filesystem::path& Path)
{
	if( is_open() == true )
	{
		return nullptr;
	}

	FileIn.open(Path, std::ios::binary | std::ios::ate);

	if( FileIn.is_open() == false )
	{
		close();
		return nullptr;
	}

	const std::ifstream::pos_type FileSize = FileIn.tellg();

	if( FileSize % VirtualPage::PageSize != 0 )
	{
		// File size is not pagealigned
		close();
		return nullptr;
	}

	PageCount = static_cast<std::uint32_t>(FileSize) / VirtualPage::PageSize;

	seekpos(0);

	return this;
}